

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void m68k_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  uc_struct *uc_00;
  TCGContext *tcg_ctx_00;
  CPUM68KState_conflict *env_00;
  _Bool _Var1;
  uint16_t uVar2;
  int iVar3;
  uint16_t insn;
  CPUM68KState_conflict *env;
  TCGContext_conflict2 *tcg_ctx;
  uc_struct_conflict3 *uc;
  DisasContextBase_conflict1 *__mptr;
  DisasContext_conflict2 *dc;
  CPUState *cpu_local;
  DisasContextBase_conflict1 *dcbase_local;
  
  uc_00 = *(uc_struct **)&dcbase[6].is_jmp;
  tcg_ctx_00 = uc_00->tcg_ctx;
  env_00 = (CPUM68KState_conflict *)cpu->env_ptr;
  iVar3 = uc_addr_is_exit(uc_00,(ulong)dcbase[1].pc_first);
  if (iVar3 == 0) {
    _Var1 = _hook_exists_bounded(uc_00->hook[2].head,(ulong)dcbase[1].pc_first);
    if (_Var1) {
      tcg_gen_movi_i32((TCGContext_conflict2 *)tcg_ctx_00,QREG_PC,dcbase[1].pc_first);
      gen_uc_tracecode((TCGContext_conflict2 *)tcg_ctx_00,2,2,uc_00,(ulong)dcbase[1].pc_first);
      check_exit_request_m68k((TCGContext_conflict2 *)tcg_ctx_00);
    }
    uVar2 = read_im16(env_00,(DisasContext_conflict2 *)dcbase);
    (*opcode_table[uVar2])(env_00,(DisasContext_conflict2 *)dcbase,uVar2);
    do_writebacks((DisasContext_conflict2 *)dcbase);
    do_release((DisasContext_conflict2 *)dcbase);
    dcbase->pc_next = dcbase[1].pc_first;
    if ((dcbase->is_jmp == DISAS_NEXT) &&
       (0xfdf < dcbase[1].pc_first - (dcbase->pc_first & 0xfffff000))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    gen_exception((DisasContext_conflict2 *)dcbase,dcbase[1].pc_first,0x10001);
  }
  return;
}

Assistant:

static void m68k_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUM68KState *env = cpu->env_ptr;
    uint16_t insn;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dc->pc)) {
        gen_exception(dc, dc->pc, EXCP_HLT);
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->pc)) {

        // Sync PC in advance
        tcg_gen_movi_i32(tcg_ctx, QREG_PC, dc->pc);

        gen_uc_tracecode(tcg_ctx, 2, UC_HOOK_CODE_IDX, uc, dc->pc);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    insn = read_im16(env, dc);

    opcode_table[insn](env, dc, insn);
    do_writebacks(dc);
    do_release(dc);

    dc->base.pc_next = dc->pc;

    if (dc->base.is_jmp == DISAS_NEXT) {
        /*
         * Stop translation when the next insn might touch a new page.
         * This ensures that prefetch aborts at the right place.
         *
         * We cannot determine the size of the next insn without
         * completely decoding it.  However, the maximum insn size
         * is 32 bytes, so end if we do not have that much remaining.
         * This may produce several small TBs at the end of each page,
         * but they will all be linked with goto_tb.
         *
         * ??? ColdFire maximum is 4 bytes; MC68000's maximum is also
         * smaller than MC68020's.
         */
        target_ulong start_page_offset
            = dc->pc - (dc->base.pc_first & TARGET_PAGE_MASK);

        if (start_page_offset >= TARGET_PAGE_SIZE - 32) {
            dc->base.is_jmp = DISAS_TOO_MANY;
        }
    }
}